

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

void __thiscall
QFileSystemModelPrivate::directoryChanged
          (QFileSystemModelPrivate *this,QString *directory,QStringList *files)

{
  long lVar1;
  bool bVar2;
  QFileSystemNode *this_00;
  qsizetype qVar3;
  iterator this_01;
  iterator o;
  QFileSystemNode **ppQVar4;
  long lVar5;
  iterator in_RDI;
  long in_FS_OFFSET;
  int i_1;
  QFileSystemNode *parentNode;
  iterator iterator;
  const_iterator cend;
  const_iterator i;
  QStringList newFiles;
  QStringList toRemove;
  QList<QString> *in_stack_ffffffffffffff28;
  QList<QString> *in_stack_ffffffffffffff30;
  const_iterator *in_stack_ffffffffffffff38;
  iterator in_stack_ffffffffffffff40;
  int local_ac;
  iterator in_stack_ffffffffffffff60;
  iterator in_stack_ffffffffffffff68;
  iterator local_60;
  piter local_58;
  piter local_48;
  undefined1 *local_38;
  undefined8 in_stack_ffffffffffffffd0;
  QString *in_stack_ffffffffffffffd8;
  QFileSystemModelPrivate *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = node(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                 SUB81((ulong)in_stack_ffffffffffffffd0 >> 0x38,0));
  qVar3 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::size(&this_00->children);
  if (qVar3 != 0) {
    QList<QString>::QList((QList<QString> *)0xaa9bb9);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::QList(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    QList<QString>::begin(in_stack_ffffffffffffff30);
    this_01 = QList<QString>::end(in_stack_ffffffffffffff30);
    std::sort<QList<QString>::iterator>(in_RDI,in_stack_ffffffffffffff40);
    local_48.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_> *)
                 &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (piter)QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::constBegin
                                ((QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)
                                 in_RDI.i);
    local_58.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data<QHashPrivate::Node<QString,_QFileSystemModelPrivate::QFileSystemNode_*>_> *)
                 &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (piter)QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::constEnd
                                ((QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)
                                 in_stack_ffffffffffffff38);
    while (bVar2 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::const_iterator::
                   operator!=(in_stack_ffffffffffffff38,(const_iterator *)in_stack_ffffffffffffff30)
          , bVar2) {
      local_60.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffff68 = QList<QString>::begin(in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff60 = QList<QString>::end(in_stack_ffffffffffffff30);
      QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::const_iterator::value
                ((const_iterator *)0xaa9cfe);
      local_60 = std::lower_bound<QList<QString>::iterator,QString>
                           (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffff40.i);
      o = QList<QString>::end(in_stack_ffffffffffffff30);
      bVar2 = QList<QString>::iterator::operator==(&local_60,o);
      if (bVar2) {
LAB_00aa9d6c:
        QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::const_iterator::value
                  ((const_iterator *)0xaa9d79);
        QList<QString>::append(in_stack_ffffffffffffff30,(parameter_type)in_stack_ffffffffffffff28);
      }
      else {
        ppQVar4 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::const_iterator::value
                            ((const_iterator *)0xaa9d47);
        in_stack_ffffffffffffff40.i = &(*ppQVar4)->fileName;
        QList<QString>::iterator::operator*(&local_60);
        bVar2 = ::operator<((QString *)in_stack_ffffffffffffff30,
                            (QString *)in_stack_ffffffffffffff28);
        if (bVar2) goto LAB_00aa9d6c;
      }
      QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::const_iterator::operator++
                ((const_iterator *)in_stack_ffffffffffffff40.i);
    }
    local_ac = 0;
    while( true ) {
      lVar5 = (long)local_ac;
      qVar3 = QList<QString>::size((QList<QString> *)&stack0xffffffffffffffe0);
      if (qVar3 <= lVar5) break;
      QList<QString>::operator[]((QList<QString> *)this_00,(qsizetype)in_stack_ffffffffffffff28);
      removeNode((QFileSystemModelPrivate *)this_01.i,(QFileSystemNode *)in_stack_ffffffffffffff68.i
                 ,in_stack_ffffffffffffff60.i);
      local_ac = local_ac + 1;
    }
    QList<QString>::~QList((QList<QString> *)0xaa9e11);
    QList<QString>::~QList((QList<QString> *)0xaa9e1e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileSystemModelPrivate::directoryChanged(const QString &directory, const QStringList &files)
{
    QFileSystemModelPrivate::QFileSystemNode *parentNode = node(directory, false);
    if (parentNode->children.size() == 0)
        return;
    QStringList toRemove;
    QStringList newFiles = files;
    std::sort(newFiles.begin(), newFiles.end());
    for (auto i = parentNode->children.constBegin(), cend = parentNode->children.constEnd(); i != cend; ++i) {
        QStringList::iterator iterator = std::lower_bound(newFiles.begin(), newFiles.end(), i.value()->fileName);
        if ((iterator == newFiles.end()) || (i.value()->fileName < *iterator))
            toRemove.append(i.value()->fileName);
    }
    for (int i = 0 ; i < toRemove.size() ; ++i )
        removeNode(parentNode, toRemove[i]);
}